

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  bool bVar13;
  SQFunctionProto *x;
  SQREADFUNC in_RCX;
  SQUserPointer in_RDX;
  SQVM *in_RSI;
  SQLocalVarInfo lvi;
  SQObjectPtr name_1;
  SQUnsignedInteger type;
  SQObjectPtr proto;
  SQFunctionProto *f;
  SQObjectPtr o;
  SQObjectPtr name;
  SQObjectPtr sourcename;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQInteger i;
  SQUserPointer in_stack_fffffffffffffe78;
  SQLocalVarInfo *up_00;
  SQLocalVarInfo *in_stack_fffffffffffffe80;
  HSQUIRRELVM in_stack_fffffffffffffe88;
  HSQUIRRELVM v_00;
  undefined1 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe91;
  undefined1 in_stack_fffffffffffffe92;
  undefined1 in_stack_fffffffffffffe93;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe99;
  undefined1 in_stack_fffffffffffffe9a;
  undefined1 in_stack_fffffffffffffe9b;
  undefined1 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  undefined1 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea6;
  SQInteger in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  SQObjectPtr *in_stack_fffffffffffffec0;
  SQREADFUNC in_stack_fffffffffffffec8;
  SQSharedState *in_stack_fffffffffffffed0;
  HSQUIRRELVM in_stack_fffffffffffffed8;
  SQInteger in_stack_fffffffffffffee0;
  SQInteger in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  SQObjectPtr local_f0;
  SQObjectPtr local_d8;
  SQFunctionProto *local_c8;
  int local_bc;
  SQObjectPtr local_b8 [2];
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  HSQUIRRELVM local_78;
  long local_70;
  SQLocalVarInfo *local_60;
  SQLocalVarInfo *local_58;
  long local_50;
  long local_48;
  long local_40;
  long lVar14;
  byte *ret_00;
  byte local_9;
  
  ::SQObjectPtr::SQObjectPtr(&local_88);
  ::SQObjectPtr::SQObjectPtr(&local_98);
  ::SQObjectPtr::SQObjectPtr(local_b8);
  uVar1 = CheckTag(in_stack_fffffffffffffe88,(SQREADFUNC)in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78,0);
  if ((bool)uVar1) {
    uVar2 = ReadObject(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8
                       ,in_stack_fffffffffffffec0);
    if ((bool)uVar2) {
      uVar3 = ReadObject(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if ((bool)uVar3) {
        uVar4 = CheckTag(in_stack_fffffffffffffe88,(SQREADFUNC)in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78,0);
        if ((bool)uVar4) {
          uVar5 = SafeRead((HSQUIRRELVM)
                           CONCAT17(in_stack_fffffffffffffe9f,
                                    CONCAT16(in_stack_fffffffffffffe9e,
                                             CONCAT15(in_stack_fffffffffffffe9d,
                                                      CONCAT14(in_stack_fffffffffffffe9c,
                                                               CONCAT13(in_stack_fffffffffffffe9b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe9a,
                                                  CONCAT11(in_stack_fffffffffffffe99,
                                                           in_stack_fffffffffffffe98))))))),
                           (SQREADFUNC)
                           CONCAT17(in_stack_fffffffffffffe97,
                                    CONCAT16(in_stack_fffffffffffffe96,
                                             CONCAT15(in_stack_fffffffffffffe95,
                                                      CONCAT14(in_stack_fffffffffffffe94,
                                                               CONCAT13(in_stack_fffffffffffffe93,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                           in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           (SQInteger)in_stack_fffffffffffffe78);
          if ((bool)uVar5) {
            uVar6 = SafeRead((HSQUIRRELVM)
                             CONCAT17(in_stack_fffffffffffffe9f,
                                      CONCAT16(in_stack_fffffffffffffe9e,
                                               CONCAT15(in_stack_fffffffffffffe9d,
                                                        CONCAT14(in_stack_fffffffffffffe9c,
                                                                 CONCAT13(in_stack_fffffffffffffe9b,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe9a,
                                                  CONCAT11(in_stack_fffffffffffffe99,
                                                           in_stack_fffffffffffffe98))))))),
                             (SQREADFUNC)
                             CONCAT17(in_stack_fffffffffffffe97,
                                      CONCAT16(in_stack_fffffffffffffe96,
                                               CONCAT15(in_stack_fffffffffffffe95,
                                                        CONCAT14(in_stack_fffffffffffffe94,
                                                                 CONCAT13(in_stack_fffffffffffffe93,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),
                             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                             (SQInteger)in_stack_fffffffffffffe78);
            if ((bool)uVar6) {
              uVar7 = SafeRead((HSQUIRRELVM)
                               CONCAT17(in_stack_fffffffffffffe9f,
                                        CONCAT16(in_stack_fffffffffffffe9e,
                                                 CONCAT15(in_stack_fffffffffffffe9d,
                                                          CONCAT14(in_stack_fffffffffffffe9c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                               ,(SQREADFUNC)
                                CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                               ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                               (SQInteger)in_stack_fffffffffffffe78);
              if ((bool)uVar7) {
                uVar8 = SafeRead((HSQUIRRELVM)
                                 CONCAT17(in_stack_fffffffffffffe9f,
                                          CONCAT16(in_stack_fffffffffffffe9e,
                                                   CONCAT15(in_stack_fffffffffffffe9d,
                                                            CONCAT14(in_stack_fffffffffffffe9c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                 ,(SQREADFUNC)
                                  CONCAT17(in_stack_fffffffffffffe97,
                                           CONCAT16(in_stack_fffffffffffffe96,
                                                    CONCAT15(in_stack_fffffffffffffe95,
                                                             CONCAT14(in_stack_fffffffffffffe94,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                 ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                 (SQInteger)in_stack_fffffffffffffe78);
                if ((bool)uVar8) {
                  uVar9 = SafeRead((HSQUIRRELVM)
                                   CONCAT17(in_stack_fffffffffffffe9f,
                                            CONCAT16(in_stack_fffffffffffffe9e,
                                                     CONCAT15(in_stack_fffffffffffffe9d,
                                                              CONCAT14(in_stack_fffffffffffffe9c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                   ,(SQREADFUNC)
                                    CONCAT17(in_stack_fffffffffffffe97,
                                             CONCAT16(in_stack_fffffffffffffe96,
                                                      CONCAT15(in_stack_fffffffffffffe95,
                                                               CONCAT14(in_stack_fffffffffffffe94,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                   ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                   (SQInteger)in_stack_fffffffffffffe78);
                  if ((bool)uVar9) {
                    uVar10 = SafeRead((HSQUIRRELVM)
                                      CONCAT17(in_stack_fffffffffffffe9f,
                                               CONCAT16(in_stack_fffffffffffffe9e,
                                                        CONCAT15(in_stack_fffffffffffffe9d,
                                                                 CONCAT14(in_stack_fffffffffffffe9c,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                      ,(SQREADFUNC)
                                       CONCAT17(in_stack_fffffffffffffe97,
                                                CONCAT16(in_stack_fffffffffffffe96,
                                                         CONCAT15(in_stack_fffffffffffffe95,
                                                                  CONCAT14(in_stack_fffffffffffffe94
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                      ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                      (SQInteger)in_stack_fffffffffffffe78);
                    if ((bool)uVar10) {
                      uVar11 = SafeRead((HSQUIRRELVM)
                                        CONCAT17(in_stack_fffffffffffffe9f,
                                                 CONCAT16(in_stack_fffffffffffffe9e,
                                                          CONCAT15(in_stack_fffffffffffffe9d,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe9c,
                                                  CONCAT13(in_stack_fffffffffffffe9b,
                                                           CONCAT12(in_stack_fffffffffffffe9a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe99,
                                                  in_stack_fffffffffffffe98))))))),
                                        (SQREADFUNC)
                                        CONCAT17(in_stack_fffffffffffffe97,
                                                 CONCAT16(in_stack_fffffffffffffe96,
                                                          CONCAT15(in_stack_fffffffffffffe95,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(in_stack_fffffffffffffe92,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                                        in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                        (SQInteger)in_stack_fffffffffffffe78);
                      if ((bool)uVar11) {
                        uVar12 = SafeRead((HSQUIRRELVM)
                                          CONCAT17(in_stack_fffffffffffffe9f,
                                                   CONCAT16(in_stack_fffffffffffffe9e,
                                                            CONCAT15(in_stack_fffffffffffffe9d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffe9c,
                                                  CONCAT13(in_stack_fffffffffffffe9b,
                                                           CONCAT12(in_stack_fffffffffffffe9a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe99,
                                                  in_stack_fffffffffffffe98))))))),
                                          (SQREADFUNC)
                                          CONCAT17(in_stack_fffffffffffffe97,
                                                   CONCAT16(in_stack_fffffffffffffe96,
                                                            CONCAT15(in_stack_fffffffffffffe95,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(in_stack_fffffffffffffe92,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                                          in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                          (SQInteger)in_stack_fffffffffffffe78);
                        if ((bool)uVar12) {
                          in_stack_fffffffffffffe80 = local_58;
                          x = Create(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8,
                                     (SQInteger)in_stack_fffffffffffffec0,
                                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,uVar8
                                                                                        ))))))),
                                     CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,
                                                  in_stack_fffffffffffffeb0)))),
                                     in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
                                     in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
                          local_c8 = x;
                          ::SQObjectPtr::SQObjectPtr(&local_d8,x);
                          ::SQObjectPtr::operator=
                                    ((SQObjectPtr *)
                                     CONCAT17(in_stack_fffffffffffffe97,
                                              CONCAT16(in_stack_fffffffffffffe96,
                                                       CONCAT15(in_stack_fffffffffffffe95,
                                                                CONCAT14(in_stack_fffffffffffffe94,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                     ,(SQObjectPtr *)local_78);
                          ::SQObjectPtr::operator=
                                    ((SQObjectPtr *)
                                     CONCAT17(in_stack_fffffffffffffe97,
                                              CONCAT16(in_stack_fffffffffffffe96,
                                                       CONCAT15(in_stack_fffffffffffffe95,
                                                                CONCAT14(in_stack_fffffffffffffe94,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                     ,(SQObjectPtr *)local_78);
                          uVar1 = CheckTag(local_78,(SQREADFUNC)in_stack_fffffffffffffe80,local_60,0
                                          );
                          if ((bool)uVar1) {
                            up_00 = local_60;
                            v_00 = local_78;
                            for (lVar14 = 0; lVar14 < local_40; lVar14 = lVar14 + 1) {
                              in_stack_fffffffffffffea6 =
                                   ReadObject(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
                              if (!(bool)in_stack_fffffffffffffea6) {
                                local_9 = 0;
                                local_bc = 1;
                                goto LAB_00132fff;
                              }
                              ::SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         CONCAT17(in_stack_fffffffffffffe97,
                                                  CONCAT16(in_stack_fffffffffffffe96,
                                                           CONCAT15(in_stack_fffffffffffffe95,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(in_stack_fffffffffffffe92,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                                         (SQObjectPtr *)v_00);
                            }
                            uVar2 = CheckTag(v_00,(SQREADFUNC)in_stack_fffffffffffffe80,up_00,0);
                            if ((bool)uVar2) {
                              for (lVar14 = 0; lVar14 < local_48; lVar14 = lVar14 + 1) {
                                in_stack_fffffffffffffea4 =
                                     ReadObject(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                                in_stack_fffffffffffffec8,in_stack_fffffffffffffec0)
                                ;
                                if (!(bool)in_stack_fffffffffffffea4) {
                                  local_9 = 0;
                                  local_bc = 1;
                                  goto LAB_00132fff;
                                }
                                ::SQObjectPtr::operator=
                                          ((SQObjectPtr *)
                                           CONCAT17(in_stack_fffffffffffffe97,
                                                    CONCAT16(in_stack_fffffffffffffe96,
                                                             CONCAT15(in_stack_fffffffffffffe95,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(in_stack_fffffffffffffe92,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                                           (SQObjectPtr *)v_00);
                              }
                              uVar3 = CheckTag(v_00,(SQREADFUNC)in_stack_fffffffffffffe80,up_00,0);
                              if ((bool)uVar3) {
                                for (lVar14 = 0; lVar14 < local_50; lVar14 = lVar14 + 1) {
                                  ::SQObjectPtr::SQObjectPtr(&local_f0);
                                  uVar4 = SafeRead((HSQUIRRELVM)
                                                   CONCAT17(in_stack_fffffffffffffe9f,
                                                            CONCAT16(in_stack_fffffffffffffe9e,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe9d,
                                                  CONCAT14(in_stack_fffffffffffffe9c,
                                                           CONCAT13(in_stack_fffffffffffffe9b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe9a,
                                                  CONCAT11(in_stack_fffffffffffffe99,
                                                           in_stack_fffffffffffffe98))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(in_stack_fffffffffffffe97,
                                                           CONCAT16(in_stack_fffffffffffffe96,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                  if ((bool)uVar4) {
                                    uVar5 = ReadObject(in_stack_fffffffffffffed8,
                                                       in_stack_fffffffffffffed0,
                                                       in_stack_fffffffffffffec8,
                                                       in_stack_fffffffffffffec0);
                                    if ((bool)uVar5) {
                                      bVar13 = ReadObject(in_stack_fffffffffffffed8,
                                                          in_stack_fffffffffffffed0,
                                                          in_stack_fffffffffffffec8,
                                                          in_stack_fffffffffffffec0);
                                      if (bVar13) {
                                        SQOuterVar::SQOuterVar
                                                  ((SQOuterVar *)
                                                   CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,
                                                  CONCAT14(uVar12,in_stack_fffffffffffffeb0)))),
                                                  (SQObjectPtr *)x,
                                                  (SQObjectPtr *)
                                                  CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffea6,
                                                                          CONCAT15(uVar2,CONCAT14(
                                                  in_stack_fffffffffffffea4,
                                                  CONCAT13(uVar3,CONCAT12(uVar4,CONCAT11(uVar5,
                                                  bVar13))))))),
                                                  CONCAT13(in_stack_fffffffffffffe9f,
                                                           CONCAT12(in_stack_fffffffffffffe9e,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe9d,
                                                  in_stack_fffffffffffffe9c))));
                                        SQOuterVar::operator=
                                                  ((SQOuterVar *)in_stack_fffffffffffffe80,
                                                   (SQOuterVar *)up_00);
                                        SQOuterVar::~SQOuterVar
                                                  ((SQOuterVar *)in_stack_fffffffffffffe80);
                                        local_bc = 0;
                                      }
                                      else {
                                        local_9 = 0;
                                        local_bc = 1;
                                      }
                                    }
                                    else {
                                      local_9 = 0;
                                      local_bc = 1;
                                    }
                                  }
                                  else {
                                    local_9 = 0;
                                    local_bc = 1;
                                  }
                                  ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffe80->_name);
                                  if (local_bc != 0) goto LAB_00132fff;
                                }
                                uVar1 = CheckTag(v_00,(SQREADFUNC)in_stack_fffffffffffffe80,up_00,0)
                                ;
                                if ((bool)uVar1) {
                                  for (lVar14 = 0; lVar14 < (long)local_58; lVar14 = lVar14 + 1) {
                                    SQLocalVarInfo::SQLocalVarInfo(in_stack_fffffffffffffe80);
                                    in_stack_fffffffffffffe9e =
                                         ReadObject(in_stack_fffffffffffffed8,
                                                    in_stack_fffffffffffffed0,
                                                    in_stack_fffffffffffffec8,
                                                    in_stack_fffffffffffffec0);
                                    if ((bool)in_stack_fffffffffffffe9e) {
                                      in_stack_fffffffffffffe9d =
                                           SafeRead((HSQUIRRELVM)
                                                    CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                                  ,(SQREADFUNC)
                                                   CONCAT17(in_stack_fffffffffffffe97,
                                                            CONCAT16(in_stack_fffffffffffffe96,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                      if ((bool)in_stack_fffffffffffffe9d) {
                                        in_stack_fffffffffffffe9c =
                                             SafeRead((HSQUIRRELVM)
                                                      CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                                  ,(SQREADFUNC)
                                                   CONCAT17(in_stack_fffffffffffffe97,
                                                            CONCAT16(in_stack_fffffffffffffe96,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                        if ((bool)in_stack_fffffffffffffe9c) {
                                          in_stack_fffffffffffffe9b =
                                               SafeRead((HSQUIRRELVM)
                                                        CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(in_stack_fffffffffffffe9a,
                                                           CONCAT11(in_stack_fffffffffffffe99,
                                                                    in_stack_fffffffffffffe98)))))))
                                                  ,(SQREADFUNC)
                                                   CONCAT17(in_stack_fffffffffffffe97,
                                                            CONCAT16(in_stack_fffffffffffffe96,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                          if ((bool)in_stack_fffffffffffffe9b) {
                                            SQLocalVarInfo::operator=
                                                      (in_stack_fffffffffffffe80,up_00);
                                            local_bc = 0;
                                          }
                                          else {
                                            local_9 = 0;
                                            local_bc = 1;
                                          }
                                        }
                                        else {
                                          local_9 = 0;
                                          local_bc = 1;
                                        }
                                      }
                                      else {
                                        local_9 = 0;
                                        local_bc = 1;
                                      }
                                    }
                                    else {
                                      local_9 = 0;
                                      local_bc = 1;
                                    }
                                    SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x132bab);
                                    if (local_bc != 0) goto LAB_00132fff;
                                  }
                                  uVar2 = CheckTag(v_00,(SQREADFUNC)in_stack_fffffffffffffe80,up_00,
                                                   0);
                                  if ((bool)uVar2) {
                                    uVar3 = SafeRead((HSQUIRRELVM)
                                                     CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(in_stack_fffffffffffffe99,
                                                                          in_stack_fffffffffffffe98)
                                                          )))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(in_stack_fffffffffffffe97,
                                                           CONCAT16(in_stack_fffffffffffffe96,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                    if ((bool)uVar3) {
                                      uVar4 = CheckTag(v_00,(SQREADFUNC)in_stack_fffffffffffffe80,
                                                       up_00,0);
                                      if ((bool)uVar4) {
                                        uVar5 = SafeRead((HSQUIRRELVM)
                                                         CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(uVar3,uVar4))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(in_stack_fffffffffffffe97,
                                                           CONCAT16(in_stack_fffffffffffffe96,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                        if ((bool)uVar5) {
                                          uVar6 = CheckTag(v_00,(SQREADFUNC)
                                                                in_stack_fffffffffffffe80,up_00,0);
                                          if ((bool)uVar6) {
                                            uVar7 = SafeRead((HSQUIRRELVM)
                                                             CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(uVar3,uVar4))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           CONCAT13(in_stack_fffffffffffffe93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                            if ((bool)uVar7) {
                                              uVar8 = CheckTag(v_00,(SQREADFUNC)
                                                                    in_stack_fffffffffffffe80,up_00,
                                                               0);
                                              if ((bool)uVar8) {
                                                for (ret_00 = (byte *)0x0; (long)ret_00 < local_70;
                                                    ret_00 = (byte *)((long)&(((SQObjectPtr *)ret_00
                                                                              )->super_SQObject).
                                                                             _type + 1)) {
                                                  in_stack_fffffffffffffe93 =
                                                       Load(in_RSI,in_RDX,in_RCX,
                                                            (SQObjectPtr *)ret_00);
                                                  if (!(bool)in_stack_fffffffffffffe93) {
                                                    local_9 = 0;
                                                    local_bc = 1;
                                                    goto LAB_00132fff;
                                                  }
                                                  ::SQObjectPtr::operator=
                                                            ((SQObjectPtr *)
                                                             CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(
                                                  uVar7,CONCAT14(uVar8,CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(in_stack_fffffffffffffe92,
                                                           CONCAT11(in_stack_fffffffffffffe91,
                                                                    in_stack_fffffffffffffe90)))))))
                                                  ,(SQObjectPtr *)v_00);
                                                }
                                                uVar9 = SafeRead((HSQUIRRELVM)
                                                                 CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(uVar3,uVar4))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,
                                                  CONCAT14(uVar8,CONCAT13(in_stack_fffffffffffffe93,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  CONCAT11(in_stack_fffffffffffffe91,
                                                           in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                                if ((bool)uVar9) {
                                                  uVar10 = SafeRead((HSQUIRRELVM)
                                                                    CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(uVar3,uVar4))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,
                                                  CONCAT14(uVar8,CONCAT13(in_stack_fffffffffffffe93,
                                                                          CONCAT12(uVar9,CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                                  if ((bool)uVar10) {
                                                    bVar13 = SafeRead((HSQUIRRELVM)
                                                                      CONCAT17(uVar1,CONCAT16(
                                                  in_stack_fffffffffffffe9e,
                                                  CONCAT15(in_stack_fffffffffffffe9d,
                                                           CONCAT14(in_stack_fffffffffffffe9c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe9b,
                                                  CONCAT12(uVar2,CONCAT11(uVar3,uVar4))))))),
                                                  (SQREADFUNC)
                                                  CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,
                                                  CONCAT14(uVar8,CONCAT13(in_stack_fffffffffffffe93,
                                                                          CONCAT12(uVar9,CONCAT11(
                                                  uVar10,in_stack_fffffffffffffe90))))))),v_00,
                                                  in_stack_fffffffffffffe80,(SQInteger)up_00);
                                                  if (bVar13) {
                                                    ::SQObjectPtr::operator=
                                                              ((SQObjectPtr *)
                                                               CONCAT17(uVar5,CONCAT16(uVar6,
                                                  CONCAT15(uVar7,CONCAT14(uVar8,CONCAT13(
                                                  in_stack_fffffffffffffe93,
                                                  CONCAT12(uVar9,CONCAT11(uVar10,bVar13))))))),
                                                  (SQFunctionProto *)v_00);
                                                  local_9 = 1;
                                                  local_bc = 1;
                                                  }
                                                  else {
                                                    local_9 = 0;
                                                    local_bc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_9 = 0;
                                                    local_bc = 1;
                                                  }
                                                }
                                                else {
                                                  local_9 = 0;
                                                  local_bc = 1;
                                                }
                                              }
                                              else {
                                                local_9 = 0;
                                                local_bc = 1;
                                              }
                                            }
                                            else {
                                              local_9 = 0;
                                              local_bc = 1;
                                            }
                                          }
                                          else {
                                            local_9 = 0;
                                            local_bc = 1;
                                          }
                                        }
                                        else {
                                          local_9 = 0;
                                          local_bc = 1;
                                        }
                                      }
                                      else {
                                        local_9 = 0;
                                        local_bc = 1;
                                      }
                                    }
                                    else {
                                      local_9 = 0;
                                      local_bc = 1;
                                    }
                                  }
                                  else {
                                    local_9 = 0;
                                    local_bc = 1;
                                  }
                                }
                                else {
                                  local_9 = 0;
                                  local_bc = 1;
                                }
                              }
                              else {
                                local_9 = 0;
                                local_bc = 1;
                              }
                            }
                            else {
                              local_9 = 0;
                              local_bc = 1;
                            }
                          }
                          else {
                            local_9 = 0;
                            local_bc = 1;
                          }
LAB_00132fff:
                          ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffe80->_name);
                        }
                        else {
                          local_9 = 0;
                          local_bc = 1;
                        }
                      }
                      else {
                        local_9 = 0;
                        local_bc = 1;
                      }
                    }
                    else {
                      local_9 = 0;
                      local_bc = 1;
                    }
                  }
                  else {
                    local_9 = 0;
                    local_bc = 1;
                  }
                }
                else {
                  local_9 = 0;
                  local_bc = 1;
                }
              }
              else {
                local_9 = 0;
                local_bc = 1;
              }
            }
            else {
              local_9 = 0;
              local_bc = 1;
            }
          }
          else {
            local_9 = 0;
            local_bc = 1;
          }
        }
        else {
          local_9 = 0;
          local_bc = 1;
        }
      }
      else {
        local_9 = 0;
        local_bc = 1;
      }
    }
    else {
      local_9 = 0;
      local_bc = 1;
    }
  }
  else {
    local_9 = 0;
    local_bc = 1;
  }
  ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffe80->_name);
  ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffe80->_name);
  ::SQObjectPtr::~SQObjectPtr(&in_stack_fffffffffffffe80->_name);
  return (bool)(local_9 & 1);
}

Assistant:

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    SQInteger i, nliterals,nparameters;
    SQInteger noutervalues ,nlocalvarinfos ;
    SQInteger nlineinfos,ninstructions ,nfunctions,ndefaultparams ;
    SQObjectPtr sourcename, name;
    SQObjectPtr o;
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(ReadObject(v, up, read, sourcename));
    _CHECK_IO(ReadObject(v, up, read, name));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, &nliterals, sizeof(nliterals)));
    _CHECK_IO(SafeRead(v,read,up, &nparameters, sizeof(nparameters)));
    _CHECK_IO(SafeRead(v,read,up, &noutervalues, sizeof(noutervalues)));
    _CHECK_IO(SafeRead(v,read,up, &nlocalvarinfos, sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeRead(v,read,up, &nlineinfos, sizeof(nlineinfos)));
    _CHECK_IO(SafeRead(v,read,up, &ndefaultparams, sizeof(ndefaultparams)));
    _CHECK_IO(SafeRead(v,read,up, &ninstructions, sizeof(ninstructions)));
    _CHECK_IO(SafeRead(v,read,up, &nfunctions, sizeof(nfunctions)));


    SQFunctionProto *f = SQFunctionProto::Create(_opt_ss(v),ninstructions,nliterals,nparameters,
            nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
    SQObjectPtr proto = f; //gets a ref in case of failure
    f->_sourcename = sourcename;
    f->_name = name;

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0;i < nliterals; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_literals[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nparameters; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_parameters[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < noutervalues; i++){
        SQUnsignedInteger type;
        SQObjectPtr name;
        _CHECK_IO(SafeRead(v,read,up, &type, sizeof(SQUnsignedInteger)));
        _CHECK_IO(ReadObject(v, up, read, o));
        _CHECK_IO(ReadObject(v, up, read, name));
        f->_outervalues[i] = SQOuterVar(name,o, (SQOuterType)type);
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nlocalvarinfos; i++){
        SQLocalVarInfo lvi;
        _CHECK_IO(ReadObject(v, up, read, lvi._name));
        _CHECK_IO(SafeRead(v,read,up, &lvi._pos, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._start_op, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._end_op, sizeof(SQUnsignedInteger)));
        f->_localvarinfos[i] = lvi;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_lineinfos, sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_defaultparams, sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_instructions, sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    for(i = 0; i < nfunctions; i++){
        _CHECK_IO(_funcproto(o)->Load(v, up, read, o));
        f->_functions[i] = o;
    }
    _CHECK_IO(SafeRead(v,read,up, &f->_stacksize, sizeof(f->_stacksize)));
    _CHECK_IO(SafeRead(v,read,up, &f->_bgenerator, sizeof(f->_bgenerator)));
    _CHECK_IO(SafeRead(v,read,up, &f->_varparams, sizeof(f->_varparams)));

    ret = f;
    return true;
}